

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

shared_ptr<ocl::OpenCLEngine> __thiscall
OpenCLEnum::Device::createEngine(Device *this,bool printInfo)

{
  OpenCLEngine *this_00;
  element_type *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  shared_ptr<ocl::OpenCLEngine> sVar1;
  bool printInfo_local;
  Device *this_local;
  shared_ptr<ocl::OpenCLEngine> *engine;
  
  this_00 = (OpenCLEngine *)operator_new(0x1a8);
  ocl::OpenCLEngine::OpenCLEngine(this_00);
  std::shared_ptr<ocl::OpenCLEngine>::shared_ptr<ocl::OpenCLEngine,void>
            ((shared_ptr<ocl::OpenCLEngine> *)this,this_00);
  this_01 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  ocl::OpenCLEngine::init
            (this_01,*(EVP_PKEY_CTX **)(CONCAT71(in_register_00000031,printInfo) + 0x10));
  sVar1.super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ocl::OpenCLEngine>)
         sVar1.super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ocl::OpenCLEngine> OpenCLEnum::Device::createEngine(bool printInfo) {
	std::shared_ptr<ocl::OpenCLEngine> engine(new ocl::OpenCLEngine());
	engine->init(platform_id, id, 0, printInfo);
	return engine;
}